

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetCursorPosYAndSetupForPrevLine(float pos_y,float line_height)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  (pIVar2->DC).CursorPos.y = pos_y;
  fVar1 = (pIVar2->DC).CursorMaxPos.y;
  uVar5 = -(uint)(pos_y <= fVar1);
  (pIVar2->DC).CursorMaxPos.y = (float)(~uVar5 & (uint)pos_y | (uint)fVar1 & uVar5);
  (pIVar2->DC).CursorPosPrevLine.y = pos_y - line_height;
  (pIVar2->DC).PrevLineSize.y = line_height - (pIVar4->Style).ItemSpacing.y;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3 != (ImGuiColumns *)0x0) {
    pIVar3->LineMinY = pos_y;
  }
  return;
}

Assistant:

static void SetCursorPosYAndSetupForPrevLine(float pos_y, float line_height)
{
    // Set cursor position and a few other things so that SetScrollHereY() and Columns() can work when seeking cursor.
    // FIXME: It is problematic that we have to do that here, because custom/equivalent end-user code would stumble on the same issue.
    // The clipper should probably have a 4th step to display the last item in a regular manner.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos.y = pos_y;
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, pos_y);
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y - line_height;  // Setting those fields so that SetScrollHereY() can properly function after the end of our clipper usage.
    window->DC.PrevLineSize.y = (line_height - g.Style.ItemSpacing.y);      // If we end up needing more accurate data (to e.g. use SameLine) we may as well make the clipper have a fourth step to let user process and display the last item in their list.
    if (ImGuiColumns* columns = window->DC.CurrentColumns)
        columns->LineMinY = window->DC.CursorPos.y;                         // Setting this so that cell Y position are set properly
}